

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O0

UBool generateFromUTable(CnvExtData *extData,UCMTable *table,int32_t start,int32_t limit,
                        int32_t unitIndex,uint32_t defaultValue)

{
  ushort uVar1;
  UCMapping *pUVar2;
  int32_t *piVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  undefined2 *puVar8;
  uint32_t *puVar9;
  UCMapping *m_00;
  uint32_t *puVar10;
  uint32_t local_a4;
  UCMapping *local_a0;
  UCMapping *local_98;
  UCMapping *local_90;
  uint32_t *sectionValues;
  UChar *sectionUChars;
  UChar32 prev;
  UChar32 high;
  UChar32 low;
  UChar *uchars;
  int32_t subLimit;
  int32_t subStart;
  int32_t count;
  int32_t uniqueCount;
  int32_t j;
  int32_t i;
  int32_t *map;
  UCMapping *m;
  UCMapping *mappings;
  uint32_t defaultValue_local;
  int32_t unitIndex_local;
  int32_t limit_local;
  int32_t start_local;
  UCMTable *table_local;
  CnvExtData *extData_local;
  
  pUVar2 = table->mappings;
  piVar3 = table->reverseMap;
  local_90 = pUVar2 + piVar3[start];
  if (local_90->uLen != '\x01') {
    local_90 = (UCMapping *)(table->codePoints + local_90->u);
  }
  uVar5 = (uint)*(ushort *)((long)&local_90->u + (long)unitIndex * 2);
  subStart = 1;
  sectionUChars._4_4_ = uVar5;
  for (uniqueCount = start + 1; uniqueCount < limit; uniqueCount = uniqueCount + 1) {
    local_98 = pUVar2 + piVar3[uniqueCount];
    if (local_98->uLen != '\x01') {
      local_98 = (UCMapping *)(table->codePoints + local_98->u);
    }
    uVar6 = (uint)*(ushort *)((long)&local_98->u + (long)unitIndex * 2);
    if (uVar6 != sectionUChars._4_4_) {
      subStart = subStart + 1;
      sectionUChars._4_4_ = uVar6;
    }
  }
  puVar8 = (undefined2 *)utm_allocN(extData->fromUTableUChars,subStart + 1);
  puVar9 = (uint32_t *)utm_allocN(extData->fromUTableValues,subStart + 1);
  *puVar8 = (short)subStart;
  puVar10 = puVar9 + 1;
  *puVar9 = defaultValue;
  sectionUChars._4_4_ = uVar5 - 1;
  count = 0;
  for (uniqueCount = start; uniqueCount < limit; uniqueCount = uniqueCount + 1) {
    local_a0 = pUVar2 + piVar3[uniqueCount];
    if (local_a0->uLen != '\x01') {
      local_a0 = (UCMapping *)(table->codePoints + local_a0->u);
    }
    uVar1 = *(ushort *)((long)&local_a0->u + (long)unitIndex * 2);
    if (uVar1 != sectionUChars._4_4_) {
      puVar8[(long)count + 1] = uVar1;
      puVar10[count] = uniqueCount;
      count = count + 1;
      sectionUChars._4_4_ = (uint)uVar1;
    }
  }
  uchars._0_4_ = *puVar10;
  count = 0;
  do {
    uVar7 = (uint32_t)uchars;
    if (subStart <= count) {
      return '\x01';
    }
    uchars._4_4_ = (uint32_t)uchars;
    local_a4 = limit;
    if (count + 1 < subStart) {
      local_a4 = puVar10[count + 1];
    }
    uchars._0_4_ = local_a4;
    mappings._0_4_ = 0;
    m_00 = pUVar2 + piVar3[(int)uVar7];
    if ((int)m_00->uLen == unitIndex + 1) {
      uchars._4_4_ = uVar7 + 1;
      if (((int)uchars._4_4_ < (int)local_a4) &&
         ((int)pUVar2[piVar3[(int)uchars._4_4_]].uLen == unitIndex + 1)) {
        fprintf(_stderr,"error: multiple mappings from same Unicode code points\n");
        ucm_printMapping(table,m_00,(FILE *)_stderr);
        ucm_printMapping(table,pUVar2 + piVar3[(int)uchars._4_4_],(FILE *)_stderr);
        return '\0';
      }
      mappings._0_4_ = getFromUBytesValue(extData,table,m_00);
    }
    if (uchars._4_4_ == local_a4) {
      puVar10[count] = (uint32_t)mappings;
    }
    else {
      uVar7 = utm_countItems(extData->fromUTableValues);
      puVar10[count] = uVar7;
      UVar4 = generateFromUTable(extData,table,uchars._4_4_,local_a4,unitIndex + 1,
                                 (uint32_t)mappings);
      if (UVar4 == '\0') {
        return '\0';
      }
    }
    count = count + 1;
  } while( true );
}

Assistant:

static UBool
generateFromUTable(CnvExtData *extData, UCMTable *table,
                   int32_t start, int32_t limit, int32_t unitIndex,
                   uint32_t defaultValue) {
    UCMapping *mappings, *m;
    int32_t *map;
    int32_t i, j, uniqueCount, count, subStart, subLimit;

    UChar *uchars;
    UChar32 low, high, prev;

    UChar *sectionUChars;
    uint32_t *sectionValues;

    mappings=table->mappings;
    map=table->reverseMap;

    /* step 1: examine the input units; set low, high, uniqueCount */
    m=mappings+map[start];
    uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
    low=uchars[unitIndex];
    uniqueCount=1;

    prev=high=low;
    for(i=start+1; i<limit; ++i) {
        m=mappings+map[i];
        uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
        high=uchars[unitIndex];

        if(high!=prev) {
            prev=high;
            ++uniqueCount;
        }
    }

    /* step 2: allocate the section; set count, section */
    /* the fromUTable always stores for access via binary search */
    count=uniqueCount;

    /* allocate the section: 1 entry for the header + count for the items */
    sectionUChars=(UChar *)utm_allocN(extData->fromUTableUChars, 1+count);
    sectionValues=(uint32_t *)utm_allocN(extData->fromUTableValues, 1+count);

    /* write the section header */
    *sectionUChars++=(UChar)count;
    *sectionValues++=defaultValue;

    /* step 3: write temporary section table with subsection starts */
    prev=low-1; /* just before low to prevent empty subsections before low */
    j=0; /* section table index */
    for(i=start; i<limit; ++i) {
        m=mappings+map[i];
        uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
        high=uchars[unitIndex];

        if(high!=prev) {
            /* start of a new subsection for unit high */
            prev=high;

            /* write the entry with the subsection start */
            sectionUChars[j]=(UChar)high;
            sectionValues[j]=(uint32_t)i;
            ++j;
        }
    }
    /* assert(j==count) */

    /* step 4: recurse and write results */
    subLimit=(int32_t)(sectionValues[0]);
    for(j=0; j<count; ++j) {
        subStart=subLimit;
        subLimit= (j+1)<count ? (int32_t)(sectionValues[j+1]) : limit;

        /* see if there is exactly one input unit sequence of length unitIndex+1 */
        defaultValue=0;
        m=mappings+map[subStart];
        if(m->uLen==unitIndex+1) {
            /* do not include this in generateToUTable() */
            ++subStart;

            if(subStart<subLimit && mappings[map[subStart]].uLen==unitIndex+1) {
                /* print error for multiple same-input-sequence mappings */
                fprintf(stderr, "error: multiple mappings from same Unicode code points\n");
                ucm_printMapping(table, m, stderr);
                ucm_printMapping(table, mappings+map[subStart], stderr);
                return FALSE;
            }

            defaultValue=getFromUBytesValue(extData, table, m);
        }

        if(subStart==subLimit) {
            /* write the result for the input sequence ending here */
            sectionValues[j]=defaultValue;
        } else {
            /* write the index to the subsection table */
            sectionValues[j]=(uint32_t)utm_countItems(extData->fromUTableValues);

            /* recurse */
            if(!generateFromUTable(extData, table, subStart, subLimit, unitIndex+1, defaultValue)) {
                return FALSE;
            }
        }
    }
    return TRUE;
}